

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall fmt::v9::detail::bigint::multiply(bigint *this,uint32_t value)

{
  size_t sVar1;
  uint *puVar2;
  size_t sVar3;
  ulong uVar4;
  
  sVar1 = (this->bigits_).super_buffer<unsigned_int>.size_;
  if (sVar1 == 0) {
    uVar4 = 0;
  }
  else {
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar3 = 0;
    uVar4 = 0;
    do {
      uVar4 = uVar4 + (ulong)puVar2[sVar3] * (ulong)value;
      puVar2[sVar3] = (uint)uVar4;
      uVar4 = uVar4 >> 0x20;
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  if ((uint)uVar4 != 0) {
    if ((this->bigits_).super_buffer<unsigned_int>.capacity_ < sVar1 + 1) {
      (**(this->bigits_).super_buffer<unsigned_int>._vptr_buffer)(this);
    }
    puVar2 = (this->bigits_).super_buffer<unsigned_int>.ptr_;
    sVar1 = (this->bigits_).super_buffer<unsigned_int>.size_;
    (this->bigits_).super_buffer<unsigned_int>.size_ = sVar1 + 1;
    puVar2[sVar1] = (uint)uVar4;
  }
  return;
}

Assistant:

FMT_CONSTEXPR20 void multiply(uint32_t value) {
    const double_bigit wide_value = value;
    bigit carry = 0;
    for (size_t i = 0, n = bigits_.size(); i < n; ++i) {
      double_bigit result = bigits_[i] * wide_value + carry;
      bigits_[i] = static_cast<bigit>(result);
      carry = static_cast<bigit>(result >> bigit_bits);
    }
    if (carry != 0) bigits_.push_back(carry);
  }